

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O0

void secp256k1_scalar_mul(secp256k1_scalar *r,secp256k1_scalar *a,secp256k1_scalar *b)

{
  secp256k1_scalar *in_RDX;
  secp256k1_scalar *in_RSI;
  uint64_t l [8];
  uint64_t *in_stack_00000080;
  secp256k1_scalar *in_stack_00000088;
  uint64_t auStack_58 [8];
  secp256k1_scalar *local_18;
  secp256k1_scalar *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  secp256k1_scalar_verify((secp256k1_scalar *)0x10ca4d);
  secp256k1_scalar_verify((secp256k1_scalar *)0x10ca57);
  secp256k1_scalar_mul_512(auStack_58,local_10,local_18);
  secp256k1_scalar_reduce_512(in_stack_00000088,in_stack_00000080);
  secp256k1_scalar_verify((secp256k1_scalar *)0x10ca80);
  return;
}

Assistant:

static void secp256k1_scalar_mul(secp256k1_scalar *r, const secp256k1_scalar *a, const secp256k1_scalar *b) {
    uint64_t l[8];
    SECP256K1_SCALAR_VERIFY(a);
    SECP256K1_SCALAR_VERIFY(b);

    secp256k1_scalar_mul_512(l, a, b);
    secp256k1_scalar_reduce_512(r, l);

    SECP256K1_SCALAR_VERIFY(r);
}